

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

uint64_t __thiscall
adios2::core::engine::BP5Writer::WriteMetadata
          (BP5Writer *this,vector<char,_std::allocator<char>_> *ContigMetaData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *SizeVector,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  string *process;
  JSONProfiler *this_00;
  JSONProfiler *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  __normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
  *__lhs;
  reference piVar5;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  iovec *b_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *__range2;
  value_type *b;
  size_t a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AttrSizeVector;
  uint64_t MetaDataSize;
  size_t MDataTotalSize;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffffe98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea8;
  allocator *paVar6;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  __normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
  local_e0;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *local_d8;
  allocator local_c9;
  string local_c8 [4];
  int in_stack_ffffffffffffff3c;
  TransportMan *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  TransportMan *in_stack_ffffffffffffff50;
  allocator local_a1;
  string local_a0 [32];
  undefined8 local_80;
  const_reference local_68;
  ulong local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  uint64_t local_40;
  unsigned_long *local_38;
  unsigned_long *local_30;
  unsigned_long local_28;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe98);
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe98);
  local_28 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        (unsigned_long)in_stack_fffffffffffffea0);
  local_40 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa831b8);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  local_28 = sVar4 * 8 + local_28;
  for (local_60 = 0; uVar1 = local_60,
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18),
      uVar2 = local_60, uVar1 < sVar4; local_60 = local_60 + 1) {
    sVar4 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::size(local_20);
    if (uVar2 < sVar4) {
      local_68 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                           (local_20,local_60);
      local_28 = local_68->iov_len + 8 + local_28;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8._M_current);
    }
    else {
      local_80 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
      local_28 = local_28 + 8;
    }
  }
  local_40 = 0;
  transportman::TransportMan::WriteFiles
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  local_40 = local_40 + 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8335f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  transportman::TransportMan::WriteFiles
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_58);
  local_40 = local_40 + sVar4 * 8;
  process = (string *)(in_RDI + 0x6d0);
  this_00 = (JSONProfiler *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa833d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_58);
  transportman::TransportMan::WriteFiles
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_58);
  local_40 = local_40 + sVar4 * 8;
  this_01 = (JSONProfiler *)(in_RDI + 0xb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"MetadataBlockWrite",&local_a1);
  profiling::JSONProfiler::Start(this_01,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  this_02 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x6d0);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa834a9);
  std::vector<char,_std::allocator<char>_>::size(local_10);
  transportman::TransportMan::WriteFiles
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  __lhs = (__normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
           *)(in_RDI + 0xb80);
  paVar6 = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"MetadataBlockWrite",paVar6);
  profiling::JSONProfiler::Stop(this_00,process);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(local_10);
  local_40 = sVar4 + local_40;
  local_d8 = local_20;
  local_e0._M_current =
       (iovec *)std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::begin
                          (in_stack_fffffffffffffe98);
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::end
            (in_stack_fffffffffffffe98);
  while (bVar3 = __gnu_cxx::operator!=
                           (__lhs,(__normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
                                   *)in_stack_fffffffffffffe98), bVar3) {
    piVar5 = __gnu_cxx::
             __normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
             ::operator*(&local_e0);
    if (piVar5->iov_base != (void *)0x0) {
      transportman::TransportMan::WriteFiles
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      local_40 = piVar5->iov_len + local_40;
    }
    __gnu_cxx::
    __normal_iterator<const_adios2::core::iovec_*,_std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>_>
    ::operator++(&local_e0);
  }
  transportman::TransportMan::FlushFiles(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  *(uint64_t *)(in_RDI + 0xc08) = local_40 + *(long *)(in_RDI + 0xc08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_02);
  return local_40;
}

Assistant:

uint64_t BP5Writer::WriteMetadata(const std::vector<char> &ContigMetaData,
                                  const std::vector<size_t> &SizeVector,
                                  const std::vector<core::iovec> &AttributeBlocks)
{
    size_t MDataTotalSize = std::accumulate(SizeVector.begin(), SizeVector.end(), size_t(0));
    uint64_t MetaDataSize = 0;
    std::vector<uint64_t> AttrSizeVector;

    MDataTotalSize += SizeVector.size() * sizeof(size_t);
    for (size_t a = 0; a < SizeVector.size(); a++)
    {
        if (a < AttributeBlocks.size())
        {
            auto &b = AttributeBlocks[a];
            MDataTotalSize += sizeof(uint64_t) + b.iov_len;
            AttrSizeVector.push_back(b.iov_len);
        }
        else
        {
            AttrSizeVector.push_back(0);
            MDataTotalSize += sizeof(uint64_t);
        }
    }
    MetaDataSize = 0;
    m_FileMetadataManager.WriteFiles((char *)&MDataTotalSize, sizeof(uint64_t));
    MetaDataSize += sizeof(uint64_t);
    m_FileMetadataManager.WriteFiles((char *)SizeVector.data(),
                                     sizeof(uint64_t) * SizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_FileMetadataManager.WriteFiles((char *)AttrSizeVector.data(),
                                     sizeof(uint64_t) * AttrSizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_Profiler.Start("MetadataBlockWrite");
    m_FileMetadataManager.WriteFiles(ContigMetaData.data(), ContigMetaData.size());
    m_Profiler.Stop("MetadataBlockWrite");
    MetaDataSize += ContigMetaData.size();

    for (auto &b : AttributeBlocks)
    {
        if (!b.iov_base)
            continue;
        m_FileMetadataManager.WriteFiles((char *)b.iov_base, b.iov_len);
        MetaDataSize += b.iov_len;
    }

    m_FileMetadataManager.FlushFiles();

    m_MetaDataPos += MetaDataSize;
    return MetaDataSize;
}